

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O1

void Assimp::SplitLargeMeshesProcess_Triangle::UpdateNode
               (aiNode *pcNode,
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *avList)

{
  pointer ppVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_48,(ulong)(pcNode->mNumMeshes + 1));
  if (pcNode->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      local_4c = 0;
      ppVar1 = (avList->
               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((avList->
          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
        uVar3 = 0;
        do {
          if (ppVar1[uVar3].second == pcNode->mMeshes[uVar4]) {
            if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                         (iterator)
                         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_4c);
            }
            else {
              *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_4c;
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          local_4c = local_4c + 1;
          uVar3 = (ulong)local_4c;
          ppVar1 = (avList->
                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar3 < (ulong)((long)(avList->
                                       super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >>
                                4));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pcNode->mNumMeshes);
  }
  if (pcNode->mMeshes != (uint *)0x0) {
    operator_delete__(pcNode->mMeshes);
  }
  pcNode->mNumMeshes =
       (uint)((ulong)((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar2 = (uint *)operator_new__((long)local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
  pcNode->mMeshes = puVar2;
  if (pcNode->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      pcNode->mMeshes[uVar4] =
           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < pcNode->mNumMeshes);
  }
  if (pcNode->mNumChildren != 0) {
    uVar4 = 0;
    do {
      UpdateNode(pcNode->mChildren[uVar4],avList);
      uVar4 = uVar4 + 1;
    } while (uVar4 < pcNode->mNumChildren);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::UpdateNode(aiNode* pcNode,
        const std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    // for every index in out list build a new entry
    std::vector<unsigned int> aiEntries;
    aiEntries.reserve(pcNode->mNumMeshes + 1);
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i) {
        for (unsigned int a = 0; a < avList.size();++a) {
            if (avList[a].second == pcNode->mMeshes[i]) {
                aiEntries.push_back(a);
            }
        }
    }

    // now build the new list
    delete[] pcNode->mMeshes;
    pcNode->mNumMeshes = (unsigned int)aiEntries.size();
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

    for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
        pcNode->mMeshes[b] = aiEntries[b];
    }

    // recusively update all other nodes
    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        UpdateNode ( pcNode->mChildren[i], avList );
    }
}